

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

size_t benchmark::RunSpecifiedBenchmarks
                 (BenchmarkReporter *console_reporter,BenchmarkReporter *file_reporter)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  BenchmarkFamilies *pBVar4;
  reference pIVar5;
  ostream *poVar6;
  pointer in_RSI;
  pointer in_RDI;
  string *fname;
  OutputOptions output_opts;
  unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
  default_file_reporter;
  unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
  default_console_reporter;
  ofstream output_file;
  Instance *benchmark;
  iterator __end2;
  iterator __begin2;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  *__range2;
  BenchmarkFamilies *families;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks;
  string spec;
  ostream *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  *in_stack_fffffffffffffd10;
  OutputOptions allow_color;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  undefined1 local_290 [80];
  BenchmarkReporter *in_stack_fffffffffffffdc0;
  BenchmarkReporter *in_stack_fffffffffffffdc8;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  *in_stack_fffffffffffffdd0;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  BenchmarkFamilies *in_stack_ffffffffffffff68;
  __normal_iterator<benchmark::internal::Benchmark::Instance_*,_std::vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>_>
  local_80;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  *local_78;
  undefined4 local_6c;
  BenchmarkFamilies *local_68;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  local_60;
  string local_38 [32];
  pointer local_18;
  pointer local_10;
  size_type local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_38,(string *)&FLAGS_benchmark_filter_abi_cxx11_);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) ||
     (in_stack_fffffffffffffd3f =
           std::operator==(in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8),
     (bool)in_stack_fffffffffffffd3f)) {
    std::__cxx11::string::operator=(local_38,".");
  }
  std::
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ::vector((vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
            *)0x16837e);
  pBVar4 = internal::BenchmarkFamilies::GetInstance();
  local_68 = pBVar4;
  bVar1 = internal::BenchmarkFamilies::FindBenchmarks
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  allow_color = (OutputOptions)((ulong)pBVar4 >> 0x20);
  if (bVar1) {
    if ((FLAGS_benchmark_list_tests & 1U) == 0) {
      std::ofstream::ofstream(local_290);
      std::
      unique_ptr<benchmark::BenchmarkReporter,std::default_delete<benchmark::BenchmarkReporter>>::
      unique_ptr<std::default_delete<benchmark::BenchmarkReporter>,void>
                ((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                  *)in_stack_fffffffffffffd00);
      std::
      unique_ptr<benchmark::BenchmarkReporter,std::default_delete<benchmark::BenchmarkReporter>>::
      unique_ptr<std::default_delete<benchmark::BenchmarkReporter>,void>
                ((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                  *)in_stack_fffffffffffffd00);
      if (local_10 == (pointer)0x0) {
        internal::anon_unknown_7::CreateReporter
                  ((string *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                   allow_color);
        std::
        unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
        ::operator=((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                     *)in_stack_fffffffffffffd00,
                    (unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                     *)in_stack_fffffffffffffcf8);
        std::
        unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
        ::~unique_ptr((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                       *)in_stack_fffffffffffffd00);
        local_10 = std::
                   unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                   ::get((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                          *)in_stack_fffffffffffffd00);
      }
      bVar1 = std::operator==(in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8);
      if ((bVar1) && (local_18 != (pointer)0x0)) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "A custom file reporter was provided but --benchmark_out=<file> was not specified."
                                );
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      bVar1 = std::operator!=(in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8);
      if (bVar1) {
        std::ofstream::open(local_290,&FLAGS_benchmark_out_abi_cxx11_,0x10);
        bVar2 = std::ofstream::is_open();
        if ((bVar2 & 1) == 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"invalid file name: \'");
          poVar6 = std::operator<<(poVar6,(string *)&FLAGS_benchmark_out_abi_cxx11_);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        if (local_18 == (pointer)0x0) {
          internal::anon_unknown_7::CreateReporter
                    ((string *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                     allow_color);
          std::
          unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
          ::operator=((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                       *)in_stack_fffffffffffffd00,
                      (unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                       *)in_stack_fffffffffffffcf8);
          std::
          unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
          ::~unique_ptr((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                         *)in_stack_fffffffffffffd00);
          local_18 = std::
                     unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                     ::get((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                            *)in_stack_fffffffffffffd00);
        }
        BenchmarkReporter::SetOutputStream
                  ((BenchmarkReporter *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        BenchmarkReporter::SetErrorStream
                  ((BenchmarkReporter *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      }
      internal::anon_unknown_7::RunMatchingBenchmarks
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      std::
      unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>::
      ~unique_ptr((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                   *)in_stack_fffffffffffffd00);
      std::
      unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>::
      ~unique_ptr((unique_ptr<benchmark::BenchmarkReporter,_std::default_delete<benchmark::BenchmarkReporter>_>
                   *)in_stack_fffffffffffffd00);
      std::ofstream::~ofstream(local_290);
    }
    else {
      local_78 = &local_60;
      local_80._M_current =
           (Instance *)
           std::
           vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
           ::begin((vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                    *)in_stack_fffffffffffffcf8);
      std::
      vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
      ::end((vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
             *)in_stack_fffffffffffffcf8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<benchmark::internal::Benchmark::Instance_*,_std::vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>_>
                                 *)in_stack_fffffffffffffd00,
                                (__normal_iterator<benchmark::internal::Benchmark::Instance_*,_std::vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>_>
                                 *)in_stack_fffffffffffffcf8), bVar1) {
        pIVar5 = __gnu_cxx::
                 __normal_iterator<benchmark::internal::Benchmark::Instance_*,_std::vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>_>
                 ::operator*(&local_80);
        poVar6 = std::operator<<((ostream *)&std::cout,(string *)pIVar5);
        std::operator<<(poVar6,"\n");
        __gnu_cxx::
        __normal_iterator<benchmark::internal::Benchmark::Instance_*,_std::vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>_>
        ::operator++(&local_80);
      }
    }
    local_8 = std::
              vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ::size(&local_60);
  }
  else {
    local_8 = 0;
  }
  local_6c = 1;
  std::
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ::~vector(in_stack_fffffffffffffd10);
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

size_t RunSpecifiedBenchmarks(BenchmarkReporter* console_reporter,
                              BenchmarkReporter* file_reporter) {
  std::string spec = FLAGS_benchmark_filter;
  if (spec.empty() || spec == "all")
    spec = ".";  // Regexp that matches all benchmarks

  std::vector<internal::Benchmark::Instance> benchmarks;
  auto families = internal::BenchmarkFamilies::GetInstance();
  if (!families->FindBenchmarks(spec, &benchmarks)) return 0;

  if (FLAGS_benchmark_list_tests) {
    for (auto const& benchmark : benchmarks)
      std::cout <<  benchmark.name << "\n";
  } else {
    // Setup the reporters
    std::ofstream output_file;
    std::unique_ptr<BenchmarkReporter> default_console_reporter;
    std::unique_ptr<BenchmarkReporter> default_file_reporter;
    if (!console_reporter) {
      auto output_opts = FLAGS_color_print ? ConsoleReporter::OO_Color
                                           : ConsoleReporter::OO_None;
      default_console_reporter = internal::CreateReporter(
          FLAGS_benchmark_format, output_opts);
      console_reporter = default_console_reporter.get();
    }
    std::string const& fname = FLAGS_benchmark_out;
    if (fname == "" && file_reporter) {
      std::cerr << "A custom file reporter was provided but "
                   "--benchmark_out=<file> was not specified." << std::endl;
      std::exit(1);
    }
    if (fname != "") {
      output_file.open(fname);
      if (!output_file.is_open()) {
        std::cerr << "invalid file name: '" << fname << std::endl;
        std::exit(1);
      }
      if (!file_reporter) {
        default_file_reporter = internal::CreateReporter(
            FLAGS_benchmark_out_format, ConsoleReporter::OO_None);
        file_reporter = default_file_reporter.get();
      }
      file_reporter->SetOutputStream(&output_file);
      file_reporter->SetErrorStream(&output_file);
    }
    internal::RunMatchingBenchmarks(benchmarks, console_reporter, file_reporter);
  }
  return benchmarks.size();
}